

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenHelpers.h
# Opt level: O0

Matrix<double,_3,_3,_1,_3,_3> *
iDynTree::skew<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
          (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
           *vec)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar1;
  Matrix<double,_3,_3,_1,_3,_3> *this;
  Matrix<double,_3,_3,_1,_3,_3> *in_RDI;
  Matrix<double,_3,_3,_1,_3,_3> *in_stack_fffffffffffffe98;
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  *in_stack_fffffffffffffea0;
  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *in_stack_fffffffffffffea8;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *in_stack_fffffffffffffeb0;
  
  Eigen::Matrix<double,_3,_3,_1,_3,_3>::Matrix((Matrix<double,_3,_3,_1,_3,_3> *)0x6ca16c);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator<<
            (in_stack_fffffffffffffea8,(Scalar *)in_stack_fffffffffffffea0);
  Eigen::
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::operator[](in_stack_fffffffffffffea0,(Index)in_stack_fffffffffffffe98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
            (in_stack_fffffffffffffeb0,(Scalar *)in_stack_fffffffffffffea8);
  Eigen::
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::operator[](in_stack_fffffffffffffea0,(Index)in_stack_fffffffffffffe98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
            (in_stack_fffffffffffffeb0,(Scalar *)in_stack_fffffffffffffea8);
  Eigen::
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::operator[](in_stack_fffffffffffffea0,(Index)in_stack_fffffffffffffe98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
            (in_stack_fffffffffffffeb0,(Scalar *)in_stack_fffffffffffffea8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
            (in_stack_fffffffffffffeb0,(Scalar *)in_stack_fffffffffffffea8);
  Eigen::
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::operator[](in_stack_fffffffffffffea0,(Index)in_stack_fffffffffffffe98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
            (in_stack_fffffffffffffeb0,(Scalar *)in_stack_fffffffffffffea8);
  Eigen::
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::operator[](in_stack_fffffffffffffea0,(Index)in_stack_fffffffffffffe98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
            (in_stack_fffffffffffffeb0,(Scalar *)in_stack_fffffffffffffea8);
  Eigen::
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::operator[](in_stack_fffffffffffffea0,(Index)in_stack_fffffffffffffe98);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                     (in_stack_fffffffffffffeb0,(Scalar *)in_stack_fffffffffffffea8);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                     (pCVar1,(Scalar *)in_stack_fffffffffffffea8);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::finished(pCVar1);
  Eigen::Matrix<double,_3,_3,_1,_3,_3>::Matrix(this,in_stack_fffffffffffffe98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)0x6ca3c2);
  return in_RDI;
}

Assistant:

inline Eigen::Matrix<typename Derived::Scalar, 3, 3, Eigen::RowMajor> skew(const Eigen::MatrixBase<Derived> & vec)
{
    EIGEN_STATIC_ASSERT_VECTOR_SPECIFIC_SIZE(Derived, 3);
    return (Eigen::Matrix<typename Derived::Scalar, 3, 3, Eigen::RowMajor>() << 0.0, -vec[2], vec[1],
                                                                              vec[2], 0.0, -vec[0],
                                                                             -vec[1], vec[0], 0.0).finished();
}